

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>::
find<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> table,
          uint *params)

{
  uint uVar1;
  SegmentReader *pSVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  uint uVar8;
  uint *in_R8;
  Arena **ppAVar9;
  Maybe<unsigned_long> MVar10;
  
  pEVar7 = table.ptr;
  aVar6.value = table.size_;
  if (*(long *)(pEVar7 + 1) != 0) {
    uVar1 = *in_R8;
    uVar3 = _::chooseBucket((uint)(uVar1 != 0),(uint)*(long *)(pEVar7 + 1));
    pSVar2 = (pEVar7->value).ptr;
    uVar4 = (ulong)uVar3;
    uVar8 = *(uint *)((long)&pSVar2->arena + uVar4 * 8 + 4);
    aVar6 = extraout_RDX;
    if (uVar8 != 0) {
      ppAVar9 = &pSVar2->arena + uVar4;
      aVar6.value._4_4_ = 0;
      aVar6.value._0_4_ = *in_R8;
      do {
        if (((uVar8 != 1) && (*(uint *)ppAVar9 == (uint)(uVar1 != 0))) &&
           (*(uint *)(table.size_ + (ulong)(uVar8 - 2) * 0x18) == *in_R8)) {
          *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)
                  0x1;
          *(ulong *)(this + 8) = (ulong)(uVar8 - 2);
          goto LAB_00278f6c;
        }
        uVar5 = uVar4 + 1;
        uVar4 = uVar5 & 0xffffffff;
        if (uVar5 == *(ulong *)(pEVar7 + 1)) {
          uVar4 = 0;
        }
        ppAVar9 = &pSVar2->arena + uVar4;
        uVar8 = *(uint *)((long)ppAVar9 + 4);
      } while (uVar8 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)0x0;
LAB_00278f6c:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }